

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O2

void fast_gmm_free(fast_gmm_t *fg)

{
  gmm_select_t *ptr;
  
  if (fg == (fast_gmm_t *)0x0) {
    return;
  }
  ptr = fg->gmms;
  if (ptr->ci_occu != (int32 *)0x0) {
    ckd_free(ptr->ci_occu);
    ptr = fg->gmms;
  }
  if (ptr->idx != (int32 *)0x0) {
    ckd_free(ptr->idx);
    ptr = fg->gmms;
    if (ptr == (gmm_select_t *)0x0) goto LAB_0010d397;
  }
  ckd_free(ptr);
LAB_0010d397:
  if (fg->gaus != (gau_select_t *)0x0) {
    ckd_free(fg->gaus);
  }
  if (fg->downs != (downsampling_t *)0x0) {
    ckd_free(fg->downs);
  }
  ckd_free(fg);
  return;
}

Assistant:

void
fast_gmm_free(fast_gmm_t * fg)
{
    if (fg) {
        if (fg->gmms->ci_occu)
            ckd_free(fg->gmms->ci_occu);
        if (fg->gmms->idx)
            ckd_free(fg->gmms->idx);

        if (fg->gmms)
            ckd_free(fg->gmms);

        if (fg->gaus)
            ckd_free(fg->gaus);

        if (fg->downs)
            ckd_free(fg->downs);

        ckd_free(fg);
    }
}